

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

void advance_engine<trng::yarn3>(yarn3 *r1,long N)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  if (0 < N) {
    iVar6 = (r1->S).r[0];
    iVar5 = (r1->S).r[1];
    iVar2 = (r1->S).r[2];
    do {
      iVar1 = iVar5;
      iVar5 = iVar6;
      uVar3 = (long)iVar2 * (long)(r1->P).a[2] +
              (long)iVar1 * (long)(r1->P).a[1] + (long)iVar5 * (long)(r1->P).a[0];
      uVar4 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
      uVar3 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar3 = uVar4;
      }
      iVar6 = (int)uVar3 + -0x7fffffff;
      if (uVar3 < 0x7fffffff) {
        iVar6 = (int)uVar3;
      }
      N = N + -1;
      iVar2 = iVar1;
    } while (N != 0);
    (r1->S).r[0] = iVar6;
    (r1->S).r[1] = iVar5;
    (r1->S).r[2] = iVar1;
  }
  return;
}

Assistant:

void advance_engine(R &r1, const long N) {
  for (long i{0}; i < N; ++i)
    r1();
}